

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O2

int __thiscall embree::Distribution1D::init(Distribution1D *this,EVP_PKEY_CTX *ctx)

{
  vector<float,_std::allocator<float>_> *this_00;
  float fVar1;
  pointer pfVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  size_type in_RDX;
  float fVar5;
  undefined1 auVar6 [16];
  
  this->size = in_RDX;
  std::vector<float,_std::allocator<float>_>::resize(&this->PDF,in_RDX);
  this_00 = &this->CDF;
  std::vector<float,_std::allocator<float>_>::resize(this_00,this->size + 1);
  *(this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  for (uVar4 = 1; uVar3 = this->size, uVar4 < uVar3 + 1; uVar4 = uVar4 + 1) {
    pfVar2 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2[uVar4] = pfVar2[uVar4 - 1] + *(float *)(ctx + uVar4 * 4 + -4);
  }
  fVar1 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  fVar5 = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    auVar6 = rcpss(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
    fVar5 = (2.0 - fVar1 * auVar6._0_4_) * auVar6._0_4_;
  }
  for (uVar4 = 1; uVar4 < uVar3 + 1; uVar4 = uVar4 + 1) {
    (this->PDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4 - 1] = *(float *)(ctx + uVar4 * 4 + -4) * fVar5 * (float)uVar3;
    pfVar2 = (this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2[uVar4] = pfVar2[uVar4] * fVar5;
    uVar3 = this->size;
  }
  (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start[uVar3] = 1.0;
  return (int)uVar3;
}

Assistant:

void Distribution1D::init(const float* f, const size_t size_in)
  {
    /*! create arrays */
    size = size_in;
    PDF.resize(size);
    CDF.resize(size+1);

    /*! accumulate the function f */
    CDF[0] = 0.0f;
    for (size_t i=1; i<size+1; i++)
      CDF[i] = CDF[i-1] + f[i-1];

    /*! compute reciprocal sum */
    float rcpSum = CDF[size] == 0.0f ? 0.0f : rcp(CDF[size]);

    /*! normalize the probability distribution and cumulative distribution */
    for (size_t i = 1; i<size+1; i++) {
      PDF[i-1] = f[i-1] * rcpSum * size;
      CDF[i] *= rcpSum;
    }
    CDF[size] = 1.0f;
  }